

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O1

void __thiscall QPDFJob::UnderOverlay::UnderOverlay(UnderOverlay *this,char *which)

{
  allocator<char> local_39 [9];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,which,local_39);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->to_nr)._M_dataplus._M_p = (pointer)&(this->to_nr).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->to_nr,"1-z","");
  (this->from_nr)._M_dataplus._M_p = (pointer)&(this->from_nr).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->from_nr,"1-z","");
  (this->repeat_nr)._M_dataplus._M_p = (pointer)&(this->repeat_nr).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->repeat_nr,"");
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (QPDF *)0x0;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }